

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::set_up_containers
          (Bitmap_cubical_complex_base<double> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sizes,bool is_pos_inf)

{
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  allocator<double> local_81;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  allocator<double> local_49;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  size_type local_28;
  size_t i;
  uint multiplier;
  bool is_pos_inf_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sizes_local;
  Bitmap_cubical_complex_base<double> *this_local;
  
  i._0_4_ = 1;
  local_28 = 0;
  i._7_1_ = is_pos_inf;
  _multiplier = sizes;
  sizes_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  while( true ) {
    sVar1 = local_28;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_multiplier);
    if (sVar1 == sVar2) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_multiplier,local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->sizes,pvVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->multipliers,(value_type_conflict3 *)&i);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_multiplier,local_28);
    i._0_4_ = (*pvVar3 * 2 + 1) * (uint)i;
    local_28 = local_28 + 1;
  }
  if ((i._7_1_ & 1) == 0) {
    uVar4 = (ulong)(uint)i;
    local_80 = std::numeric_limits<double>::infinity();
    local_80 = -local_80;
    std::allocator<double>::allocator(&local_81);
    std::vector<double,_std::allocator<double>_>::vector(&local_78,uVar4,&local_80,&local_81);
    std::vector<double,_std::allocator<double>_>::operator=(&this->data,&local_78);
    std::vector<double,_std::allocator<double>_>::~vector(&local_78);
    std::allocator<double>::~allocator(&local_81);
  }
  else {
    uVar4 = (ulong)(uint)i;
    local_48 = std::numeric_limits<double>::infinity();
    std::allocator<double>::allocator(&local_49);
    std::vector<double,_std::allocator<double>_>::vector(&local_40,uVar4,&local_48,&local_49);
    std::vector<double,_std::allocator<double>_>::operator=(&this->data,&local_40);
    std::vector<double,_std::allocator<double>_>::~vector(&local_40);
    std::allocator<double>::~allocator(&local_49);
  }
  return;
}

Assistant:

void set_up_containers(const std::vector<unsigned>& sizes, bool is_pos_inf) {
    // The fact that multipliers[0]=1 is relied on by optimizations in other functions
    unsigned multiplier = 1;
    for (std::size_t i = 0; i != sizes.size(); ++i) {
      this->sizes.push_back(sizes[i]);
      this->multipliers.push_back(multiplier);
      multiplier *= 2 * sizes[i] + 1;
    }
    if(is_pos_inf)
      this->data = std::vector<T>(multiplier, std::numeric_limits<T>::infinity());
    else
      this->data = std::vector<T>(multiplier, -std::numeric_limits<T>::infinity());
  }